

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

streamsize __thiscall
httplib::DataSink::data_sink_streambuf::xsputn(data_sink_streambuf *this,char *s,streamsize n)

{
  _Any_data *p_Var1;
  unsigned_long local_18;
  char *local_10;
  
  p_Var1 = (_Any_data *)this->sink_;
  local_18 = n;
  local_10 = s;
  if (*(long *)(p_Var1 + 1) != 0) {
    (**(code **)((long)p_Var1 + 0x18))(p_Var1,&local_10,&local_18);
    return n;
  }
  std::__throw_bad_function_call();
}

Assistant:

std::streamsize xsputn(const char *s, std::streamsize n) {
				sink_.write(s, static_cast<size_t>(n));
				return n;
			}